

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix2.c
# Opt level: O1

char * test_matrix2_invert(void)

{
  short sVar1;
  long lVar2;
  matrix2 m;
  anon_union_32_5_d0a4420b_for_matrix2_0 local_38;
  
  local_38.m[2] = -1.0;
  local_38.m[3] = 5.0;
  local_38.m[0] = 2.0;
  local_38.m[1] = 0.0;
  matrix2_invert((matrix2 *)&local_38.field_1);
  lVar2 = 0;
  do {
    sVar1 = scalar_equalsf(*(double *)((long)&local_38 + lVar2),
                           *(double *)((long)&DAT_00115cd0 + lVar2));
    if (sVar1 == 0) {
      return 
      "/workspace/llm4binary/github/license_c_cmakelists/dagostinelli[P]hypatia/test/test_matrix2.c(145) : (assertion failed) ((scalar_equalsf(m.m[i], expected.m[i])))"
      ;
    }
    lVar2 = lVar2 + 8;
  } while (lVar2 != 0x20);
  return (char *)0x0;
}

Assistant:

static char *test_matrix2_invert(void)
{
	struct matrix2 m = {2, 0, -1, 5};
	struct matrix2 expected = {(HYP_FLOAT)0.5, (HYP_FLOAT)0.0, (HYP_FLOAT)0.1, (HYP_FLOAT)0.2};
	uint8_t i;

	matrix2_invert(&m);
	for (i = 0; i < 4; i++) {
		test_assert(scalar_equals(m.m[i], expected.m[i]));
	}

	return NULL;
}